

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::ScanInitialImplicitRoots
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((this->
             super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ).fullBlockList,
             (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_b8cf05bd)recycler);
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_2_>
            ((this->
             super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ).heapBlockList,
             (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (anon_class_8_1_b8cf05bd)recycler);
  bVar3 = recycler->inPartialCollectMode;
  if (((bool)bVar3 == false) &&
     (this->partialHeapBlockList !=
      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x3e,"(recycler->inPartialCollectMode || partialHeapBlockList == nullptr)",
                       "recycler->inPartialCollectMode || partialHeapBlockList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    bVar3 = recycler->inPartialCollectMode;
  }
  if ((bVar3 & 1) != 0) {
    HeapBlockList::
    ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_3_>
              (this->partialHeapBlockList,
               (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
               (anon_class_8_1_b8cf05bd)recycler);
    HeapBlockList::
    ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::ScanInitialImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_4_>
              (this->partialSweptHeapBlockList,
               (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
               (anon_class_8_1_b8cf05bd)recycler);
    return;
  }
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::ScanInitialImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(this->fullBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBlockList::ForEach(this->sweepableHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanInitialImplicitRoots(recycler);
        });
    }
#endif

    HeapBlockList::ForEach(this->heapBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#if ENABLE_PARTIAL_GC
    Assert(recycler->inPartialCollectMode || partialHeapBlockList == nullptr);
    if (recycler->inPartialCollectMode)
    {
        HeapBlockList::ForEach(partialHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanInitialImplicitRoots(recycler);
        });
#if ENABLE_CONCURRENT_GC
        HeapBlockList::ForEach(partialSweptHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanInitialImplicitRoots(recycler);
        });
#endif
    }
#endif
}